

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * operator+(Matrix *__return_storage_ptr__,Matrix *lhs,Matrix *rhs)

{
  int iVar1;
  Fraction *pFVar2;
  Fraction *b;
  Fraction FVar3;
  invalid_argument *this;
  int i;
  int iVar4;
  
  if (lhs->n_ == rhs->n_) {
    if (lhs->m_ == rhs->m_) {
      i = 0;
      Matrix::Matrix(__return_storage_ptr__,lhs->n_,lhs->m_,0);
      iVar4 = __return_storage_ptr__->n_;
      if (0 < iVar4) {
        iVar1 = __return_storage_ptr__->m_;
        do {
          if (0 < iVar1) {
            iVar4 = 0;
            do {
              pFVar2 = Matrix::At(lhs,i,iVar4);
              b = Matrix::At(rhs,i,iVar4);
              FVar3 = operator+(pFVar2,b);
              pFVar2 = Matrix::At(__return_storage_ptr__,i,iVar4);
              *pFVar2 = FVar3;
              iVar4 = iVar4 + 1;
              iVar1 = __return_storage_ptr__->m_;
            } while (iVar4 < iVar1);
            iVar4 = __return_storage_ptr__->n_;
          }
          i = i + 1;
        } while (i < iVar4);
      }
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"[SUM] Mismatched number of columns");
  }
  else {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"[SUM] Mismatched number of rows");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Matrix operator+(const Matrix& lhs, const Matrix& rhs) {
  if (lhs.GetNumRows() != rhs.GetNumRows()) {
    throw std::invalid_argument("[SUM] Mismatched number of rows");
  }

  if (lhs.GetNumColumns() != rhs.GetNumColumns()) {
    throw std::invalid_argument("[SUM] Mismatched number of columns");
  }

  Matrix result(lhs.GetNumRows(), lhs.GetNumColumns());
  for (int i = 0; i < result.GetNumRows(); ++i) {
    for (int j = 0; j < result.GetNumColumns(); ++j) {
      result.At(i, j) = lhs.At(i, j) + rhs.At(i, j);
    }
  }

  return result;
}